

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_insertBlock(ZSTD_DCtx *dctx,void *blockStart,size_t blockSize)

{
  ZSTD_checkContinuity(dctx,blockStart);
  dctx->previousDstEnd = (void *)((long)blockStart + blockSize);
  return blockSize;
}

Assistant:

size_t ZSTD_insertBlock(ZSTD_DCtx* dctx, const void* blockStart, size_t blockSize)
{
    DEBUGLOG(5, "ZSTD_insertBlock: %u bytes", (unsigned)blockSize);
    ZSTD_checkContinuity(dctx, blockStart);
    dctx->previousDstEnd = (const char*)blockStart + blockSize;
    return blockSize;
}